

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

IStream * __thiscall Catch::Config::openStream(Config *this)

{
  int iVar1;
  FileStream *this_00;
  domain_error *this_01;
  string *filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((this->m_data).outputFilename._M_string_length == 0) {
    this_00 = (FileStream *)operator_new(0x118);
    (this_00->super_IStream)._vptr_IStream = (_func_int **)&PTR__CoutStream_001af4b8;
    std::ostream::ostream
              ((unique_ptr<Catch::StreamBufBase,_std::default_delete<Catch::StreamBufBase>_> *)
               &this_00->m_ofs,
               *(streambuf **)(std::__cxx11::stringbuf::str + *(long *)(std::cout + -0x18)));
  }
  else {
    filename = &(this->m_data).outputFilename;
    if (*(filename->_M_dataplus)._M_p == '%') {
      iVar1 = std::__cxx11::string::compare((char *)filename);
      if (iVar1 != 0) {
        this_01 = (domain_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_40,"Unrecognised stream: ",filename);
        std::domain_error::domain_error(this_01,(string *)&local_40);
        __cxa_throw(this_01,&std::domain_error::typeinfo,std::domain_error::~domain_error);
      }
      this_00 = (FileStream *)operator_new(0x120);
      DebugOutStream::DebugOutStream((DebugOutStream *)this_00);
    }
    else {
      this_00 = (FileStream *)operator_new(0x208);
      FileStream::FileStream(this_00,filename);
    }
  }
  return &this_00->super_IStream;
}

Assistant:

IStream const* openStream() {
            if( m_data.outputFilename.empty() )
                return new CoutStream();
            else if( m_data.outputFilename[0] == '%' ) {
                if( m_data.outputFilename == "%debug" )
                    return new DebugOutStream();
                else
                    throw std::domain_error( "Unrecognised stream: " + m_data.outputFilename );
            }
            else
                return new FileStream( m_data.outputFilename );
        }